

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::InsertStatement::OnConflictActionToString_abi_cxx11_
          (string *__return_storage_ptr__,InsertStatement *this,OnConflictAction action)

{
  int iVar1;
  NotImplementedException *this_00;
  undefined7 in_register_00000011;
  char *pcVar2;
  allocator local_39;
  string local_38;
  
  iVar1 = (int)this;
  if (iVar1 - 2U < 2) {
    pcVar2 = "DO UPDATE";
  }
  else if (iVar1 == 0) {
    pcVar2 = anon_var_dwarf_3b2a81b + 9;
  }
  else {
    if (iVar1 != 1) {
      this_00 = (NotImplementedException *)
                __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,action));
      ::std::__cxx11::string::string
                ((string *)&local_38,"type not implemented for OnConflictActionType",&local_39);
      NotImplementedException::NotImplementedException(this_00,&local_38);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar2 = "DO NOTHING";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string InsertStatement::OnConflictActionToString(OnConflictAction action) {
	switch (action) {
	case OnConflictAction::NOTHING:
		return "DO NOTHING";
	case OnConflictAction::REPLACE:
	case OnConflictAction::UPDATE:
		return "DO UPDATE";
	case OnConflictAction::THROW:
		// Explicitly left empty, for ToString purposes
		return "";
	default: {
		throw NotImplementedException("type not implemented for OnConflictActionType");
	}
	}
}